

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

shared_ptr<duckdb::Pipeline,_true> __thiscall
duckdb::Executor::CreateChildPipeline(Executor *this,Pipeline *current,PhysicalOperator *op)

{
  bool bVar1;
  undefined8 *puVar2;
  Pipeline *pPVar3;
  reference prVar4;
  PhysicalOperator *pPVar5;
  PhysicalOperator *in_RCX;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  element_type *in_RDI;
  shared_ptr<duckdb::Pipeline,_true> sVar7;
  reference_wrapper<duckdb::PhysicalOperator> current_op;
  iterator __end1;
  iterator __begin1;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *__range1;
  shared_ptr<duckdb::Pipeline,_true> *child_pipeline;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  *in_stack_ffffffffffffff68;
  Pipeline *in_stack_ffffffffffffff70;
  Executor *in_stack_ffffffffffffff98;
  reference_wrapper<duckdb::PhysicalOperator> local_60;
  reference_wrapper<duckdb::PhysicalOperator> *local_58;
  __normal_iterator<std::reference_wrapper<duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>_>
  local_50;
  long local_48;
  optional_ptr<duckdb::PhysicalOperator,_true> local_40 [3];
  undefined1 local_21;
  PhysicalOperator *local_20;
  long local_18;
  
  local_21 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  make_shared_ptr<duckdb::Pipeline,duckdb::Executor&>(in_stack_ffffffffffffff98);
  puVar2 = (undefined8 *)(local_18 + 0x40);
  pPVar3 = shared_ptr<duckdb::Pipeline,_true>::operator->
                     ((shared_ptr<duckdb::Pipeline,_true> *)in_stack_ffffffffffffff70);
  (pPVar3->sink).ptr = (PhysicalOperator *)*puVar2;
  optional_ptr<duckdb::PhysicalOperator,_true>::optional_ptr(local_40,local_20);
  pPVar3 = shared_ptr<duckdb::Pipeline,_true>::operator->
                     ((shared_ptr<duckdb::Pipeline,_true> *)in_stack_ffffffffffffff70);
  (pPVar3->source).ptr = local_40[0].ptr;
  local_48 = local_18 + 0x28;
  local_50._M_current =
       (reference_wrapper<duckdb::PhysicalOperator> *)
       ::std::
       vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ::begin(in_stack_ffffffffffffff68);
  local_58 = (reference_wrapper<duckdb::PhysicalOperator> *)
             ::std::
             vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             ::end(in_stack_ffffffffffffff68);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::reference_wrapper<duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>_>
                             *)in_stack_ffffffffffffff70,
                            (__normal_iterator<std::reference_wrapper<duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>_>
                             *)in_stack_ffffffffffffff68), _Var6._M_pi = extraout_RDX, bVar1) {
    prVar4 = __gnu_cxx::
             __normal_iterator<std::reference_wrapper<duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>_>
             ::operator*(&local_50);
    local_60._M_data = prVar4->_M_data;
    pPVar5 = ::std::reference_wrapper<duckdb::PhysicalOperator>::get(&local_60);
    _Var6._M_pi = extraout_RDX_00;
    if (pPVar5 == local_20) break;
    in_stack_ffffffffffffff70 =
         shared_ptr<duckdb::Pipeline,_true>::operator->
                   ((shared_ptr<duckdb::Pipeline,_true> *)in_stack_ffffffffffffff70);
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
    ::push_back((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                 *)in_RDI,(value_type *)pPVar3);
    __gnu_cxx::
    __normal_iterator<std::reference_wrapper<duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>_>
    ::operator++(&local_50);
  }
  sVar7.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var6._M_pi;
  sVar7.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<duckdb::Pipeline,_true>)
         sVar7.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Pipeline> Executor::CreateChildPipeline(Pipeline &current, PhysicalOperator &op) {
	D_ASSERT(!current.operators.empty());
	D_ASSERT(op.IsSource());
	// found another operator that is a source, schedule a child pipeline
	// 'op' is the source, and the sink is the same
	auto child_pipeline = make_shared_ptr<Pipeline>(*this);
	child_pipeline->sink = current.sink;
	child_pipeline->source = &op;

	// the child pipeline has the same operators up until 'op'
	for (auto current_op : current.operators) {
		if (&current_op.get() == &op) {
			break;
		}
		child_pipeline->operators.push_back(current_op);
	}

	return child_pipeline;
}